

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linuxaio_file.cpp
# Opt level: O1

void __thiscall
foxxll::linuxaio_file::serve
          (linuxaio_file *this,void *buffer,offset_type offset,size_type bytes,read_or_write op)

{
  CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  if (op == READ) {
    local_18 = 0;
    uStack_10 = (__pthread_internal_list *)0x0;
    local_28 = 0;
    uStack_20 = 0;
    aread((linuxaio_file *)&stack0xffffffffffffffd0,this,(offset_type)buffer,offset,
          (completion_handler *)bytes);
    if (local_30.ptr_ == (request *)0x0) goto LAB_0014807d;
    (**(code **)(*(long *)((long)&(local_30.ptr_)->field_0x0 +
                          *(long *)(*(_func_int **)local_30.ptr_ + -0x68)) + 0x30))
              ((long)&(local_30.ptr_)->field_0x0 + *(long *)(*(_func_int **)local_30.ptr_ + -0x68),1
              );
  }
  else {
    local_18 = 0;
    uStack_10 = (__pthread_internal_list *)0x0;
    local_28 = 0;
    uStack_20 = 0;
    awrite((linuxaio_file *)&stack0xffffffffffffffd0,this,(offset_type)buffer,offset,
           (completion_handler *)bytes);
    if (local_30.ptr_ == (request *)0x0) {
LAB_0014807d:
      __assert_fail("ptr_",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/stxxl[P]foxxll/extlib/tlx/tlx/counting_ptr.hpp"
                    ,0xc5,
                    "Type *tlx::CountingPtr<foxxll::request>::operator->() const [Type = foxxll::request, Deleter = tlx::CountingPtrDefaultDeleter]"
                   );
    }
    (**(code **)(*(long *)((long)&(local_30.ptr_)->field_0x0 +
                          *(long *)(*(_func_int **)local_30.ptr_ + -0x68)) + 0x30))
              ((long)&(local_30.ptr_)->field_0x0 + *(long *)(*(_func_int **)local_30.ptr_ + -0x68),1
              );
  }
  tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::dec_reference
            (&stack0xffffffffffffffd0);
  if ((__pthread_internal_list *)uStack_10 != (__pthread_internal_list *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uStack_10);
  }
  return;
}

Assistant:

void linuxaio_file::serve(void* buffer, offset_type offset, size_type bytes,
                          request::read_or_write op)
{
    // req need not be an linuxaio_request
    if (op == request::READ)
        aread(buffer, offset, bytes)->wait();
    else
        awrite(buffer, offset, bytes)->wait();
}